

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9ReadSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Vec_Wrd_t *pVVar6;
  Gia_Man_t *pGVar7;
  int fVerbose;
  int fVerbose_00;
  char *pcVar8;
  char *pcVar9;
  char **pnWords;
  int iVar10;
  long lVar11;
  uint local_34;
  
  bVar4 = false;
  Extra_UtilGetoptReset();
  local_34 = 4;
  bVar3 = false;
LAB_002790c1:
  do {
    while (pnWords = argv, iVar5 = Extra_UtilGetopt(argc,argv,"Wovh"), iVar10 = globalUtilOptind,
          iVar5 == 0x6f) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar5 == -1) {
      pGVar7 = pAbc->pGia;
      if (pGVar7 == (Gia_Man_t *)0x0) {
        pcVar8 = "Abc_CommandAbc9ReadSim(): There is no AIG.\n";
      }
      else {
        if (0 < pGVar7->nRegs) {
          Abc_Print(-1,"Abc_CommandAbc9ReadSim(): This command works only for combinational AIGs.\n"
                   );
          return 0;
        }
        lVar11 = (long)globalUtilOptind;
        if (argc - globalUtilOptind == 1) {
          if (bVar3) {
            Vec_WrdFreeP(&pGVar7->vSimsPo);
            pVVar6 = Vec_WrdReadHex(argv[lVar11],(int *)pnWords,fVerbose);
            pGVar7 = pAbc->pGia;
            pGVar7->vSimsPo = pVVar6;
            iVar10 = pGVar7->vCos->nSize;
            iVar5 = pVVar6->nSize / iVar10;
            if (pVVar6->nSize % iVar10 == 0) {
LAB_00279256:
              pGVar7->nSimWords = iVar5;
              return 0;
            }
            Vec_WrdFreeP(&pGVar7->vSimsPo);
            pGVar7 = pAbc->pGia;
            pVVar6 = pGVar7->vSimsPo;
          }
          else {
            Vec_WrdFreeP(&pGVar7->vSimsPi);
            pVVar6 = Vec_WrdReadHex(argv[lVar11],(int *)pnWords,fVerbose_00);
            pGVar7 = pAbc->pGia;
            pGVar7->vSimsPi = pVVar6;
            iVar10 = pGVar7->vCis->nSize;
            iVar5 = pVVar6->nSize / iVar10;
            if (pVVar6->nSize % iVar10 == 0) goto LAB_00279256;
            Vec_WrdFreeP(&pGVar7->vSimsPi);
            pGVar7 = pAbc->pGia;
            pVVar6 = pGVar7->vSimsPi;
          }
          uVar1 = pVVar6->nSize;
          uVar2 = pGVar7->vCis->nSize;
          Abc_Print(-1,
                    "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n"
                    ,(ulong)uVar1,(ulong)uVar1,(ulong)uVar2,
                    (long)(int)uVar1 % (long)(int)uVar2 & 0xffffffff);
          return 1;
        }
        pcVar8 = "File name is not given on the command line.\n";
      }
      iVar10 = -1;
      goto LAB_0027931b;
    }
    if (iVar5 == 0x76) {
      bVar4 = (bool)(bVar4 ^ 1);
      goto LAB_002790c1;
    }
    if (iVar5 != 0x57) goto LAB_00279279;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_00279279;
    }
    local_34 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar10 + 1;
    if ((int)local_34 < 0) {
LAB_00279279:
      Abc_Print(-2,"usage: &sim_read [-W num] [-ovh] <file>\n");
      Abc_Print(-2,"\t         reads simulation patterns from file\n");
      Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",(ulong)local_34);
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (!bVar3) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle reading output information [default = %s]\n",pcVar8);
      if (!bVar4) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      pcVar8 = "\t<file> : file to store the simulation info\n";
      iVar10 = -2;
LAB_0027931b:
      Abc_Print(iVar10,pcVar8);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ReadSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fOutputs = 0, nWords = 4, fVerbose = 0;
    char ** pArgvNew;
    int nArgcNew;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Wovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'o':
            fOutputs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReadSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ReadSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    if ( fOutputs )
    {
        Vec_WrdFreeP( &pAbc->pGia->vSimsPo );
        pAbc->pGia->vSimsPo = Vec_WrdReadHex( pArgvNew[0], NULL, 1 );
        if ( Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCoNum(pAbc->pGia) != 0 )
        {
            Vec_WrdFreeP( &pAbc->pGia->vSimsPo );
            Abc_Print( -1, "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n", 
                Vec_WrdSize(pAbc->pGia->vSimsPo), Vec_WrdSize(pAbc->pGia->vSimsPo), Gia_ManCiNum(pAbc->pGia), 
                Vec_WrdSize(pAbc->pGia->vSimsPo) % Gia_ManCiNum(pAbc->pGia) );
            return 1;
        }
        pAbc->pGia->nSimWords = Vec_WrdSize(pAbc->pGia->vSimsPo) / Gia_ManCoNum(pAbc->pGia);
    }
    else
    {
        Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
        pAbc->pGia->vSimsPi = Vec_WrdReadHex( pArgvNew[0], NULL, 1 );
        if ( Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) != 0 )
        {
            Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
            Abc_Print( -1, "File size (%d words) does not match the number of AIG inputs (%d %% %d != %d).\n", 
                Vec_WrdSize(pAbc->pGia->vSimsPi), Vec_WrdSize(pAbc->pGia->vSimsPi), Gia_ManCiNum(pAbc->pGia), 
                Vec_WrdSize(pAbc->pGia->vSimsPi) % Gia_ManCiNum(pAbc->pGia) );
            return 1;
        }
        pAbc->pGia->nSimWords = Vec_WrdSize(pAbc->pGia->vSimsPi) / Gia_ManCiNum(pAbc->pGia);
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_read [-W num] [-ovh] <file>\n" );
    Abc_Print( -2, "\t         reads simulation patterns from file\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", nWords );
    Abc_Print( -2, "\t-o     : toggle reading output information [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file to store the simulation info\n");
    return 1;
}